

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBCols64_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x32,int dx)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)x32;
  for (lVar2 = 0; (int)lVar2 < dst_width + -1; lVar2 = lVar2 + 2) {
    *(undefined4 *)(dst_argb + lVar2 * 4) = *(undefined4 *)(src_argb + (lVar1 >> 0x10) * 4);
    lVar1 = lVar1 + dx;
    *(undefined4 *)(dst_argb + lVar2 * 4 + 4) = *(undefined4 *)(src_argb + (lVar1 >> 0x10) * 4);
    lVar1 = lVar1 + dx;
  }
  if ((dst_width & 1U) != 0) {
    *(undefined4 *)(dst_argb + lVar2 * 4) = *(undefined4 *)(src_argb + (lVar1 >> 0x10) * 4);
  }
  return;
}

Assistant:

void ScaleARGBCols64_C(uint8_t* dst_argb,
                       const uint8_t* src_argb,
                       int dst_width,
                       int x32,
                       int dx) {
  int64_t x = (int64_t)(x32);
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[0] = src[x >> 16];
    x += dx;
    dst[1] = src[x >> 16];
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[x >> 16];
  }
}